

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

bool __thiscall OSToken::getTokenFlags(OSToken *this,CK_ULONG *flags)

{
  ulong uVar1;
  unsigned_long uVar2;
  ulong *in_RSI;
  long in_RDI;
  OSAttribute *this_00;
  OSAttribute local_b8;
  ulong *local_18;
  bool local_1;
  
  if (((*(byte *)(in_RDI + 8) & 1) == 0) ||
     (local_18 = in_RSI, uVar1 = (**(code **)(**(long **)(in_RDI + 0xc0) + 0x50))(),
     (uVar1 & 1) == 0)) {
    local_1 = false;
  }
  else {
    uVar1 = (**(code **)(**(long **)(in_RDI + 0xc0) + 0x10))(*(long **)(in_RDI + 0xc0),0x8000534b);
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      this_00 = &local_b8;
      (**(code **)(**(long **)(in_RDI + 0xc0) + 0x18))(this_00,*(long **)(in_RDI + 0xc0),0x8000534b)
      ;
      uVar2 = OSAttribute::getUnsignedLongValue(this_00);
      *local_18 = uVar2;
      OSAttribute::~OSAttribute(this_00);
      uVar1 = (**(code **)(**(long **)(in_RDI + 0xc0) + 0x10))(*(long **)(in_RDI + 0xc0),0x8000534d)
      ;
      if ((uVar1 & 1) != 0) {
        *local_18 = *local_18 | 8;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool OSToken::getTokenFlags(CK_ULONG& flags)
{
	if (!valid || !tokenObject->isValid())
	{
		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_TOKENFLAGS))
	{
		flags = tokenObject->getAttribute(CKA_OS_TOKENFLAGS).getUnsignedLongValue();

		// Check if the user PIN is initialised
		if (tokenObject->attributeExists(CKA_OS_USERPIN))
		{
			flags |= CKF_USER_PIN_INITIALIZED;
		}

		return true;
	}
	else
	{
		return false;
	}
}